

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O1

Vec_Int_t * Abc_NtkWriteMiniMapping(Abc_Ntk_t *pNtk)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  uint uVar5;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *p;
  int *piVar6;
  uint *__ptr_00;
  void *pvVar7;
  char *__s;
  size_t sVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  
  if (pNtk->ntkFunc != ABC_FUNC_MAP) {
    __assert_fail("Abc_NtkHasMapping(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                  ,0x33c,"Vec_Int_t *Abc_NtkWriteMiniMapping(Abc_Ntk_t *)");
  }
  lVar13 = 0;
  __ptr = Abc_NtkDfs(pNtk,0);
  pVVar9 = pNtk->vCis;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      *(int *)((long)pVVar9->pArray[lVar13] + 0x40) = (int)lVar13;
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vCis;
    } while (lVar13 < pVVar9->nSize);
  }
  if (__ptr->nSize < 1) {
    iVar12 = 4;
  }
  else {
    lVar11 = 0;
    iVar12 = 0;
    do {
      pvVar7 = __ptr->pArray[lVar11];
      *(int *)((long)pvVar7 + 0x40) = (int)lVar13 + (int)lVar11;
      iVar12 = iVar12 + *(int *)((long)pvVar7 + 0x1c);
      lVar11 = lVar11 + 1;
    } while (lVar11 < __ptr->nSize);
    iVar12 = iVar12 + 4;
  }
  iVar2 = pNtk->vCos->nSize;
  iVar12 = iVar12 + pNtk->nObjCounts[7];
  p = (Vec_Int_t *)malloc(0x10);
  iVar10 = 0x10;
  if (0xe < iVar2 + iVar12 + 9999U) {
    iVar10 = iVar2 + iVar12 + 10000;
  }
  p->nSize = 0;
  p->nCap = iVar10;
  if (iVar10 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar10 << 2);
  }
  p->pArray = piVar6;
  Vec_IntPush(p,pNtk->vCis->nSize);
  Vec_IntPush(p,pNtk->vCos->nSize);
  Vec_IntPush(p,pNtk->nObjCounts[7]);
  Vec_IntPush(p,pNtk->nObjCounts[8]);
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[0] = 10000;
  __ptr_00[1] = 0;
  pvVar7 = malloc(10000);
  *(void **)(__ptr_00 + 2) = pvVar7;
  if (0 < __ptr->nSize) {
    lVar13 = 0;
    do {
      plVar4 = (long *)__ptr->pArray[lVar13];
      Vec_IntPush(p,*(int *)((long)plVar4 + 0x1c));
      if (0 < *(int *)((long)plVar4 + 0x1c)) {
        lVar11 = 0;
        do {
          Vec_IntPush(p,*(int *)(*(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                          (long)*(int *)(plVar4[4] + lVar11 * 4) * 8) + 0x40));
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)((long)plVar4 + 0x1c));
      }
      __s = Mio_GateReadName((Mio_Gate_t *)plVar4[7]);
      sVar8 = strlen(__s);
      if (0 < (int)(uint)sVar8) {
        uVar15 = *__ptr_00;
        uVar3 = __ptr_00[1];
        pvVar7 = *(void **)(__ptr_00 + 2);
        uVar14 = 0;
        do {
          cVar1 = __s[uVar14];
          if (uVar3 + (int)uVar14 == uVar15) {
            if ((int)uVar15 < 0x10) {
              if (pvVar7 == (void *)0x0) {
                pvVar7 = malloc(0x10);
              }
              else {
                pvVar7 = realloc(pvVar7,0x10);
              }
              uVar15 = 0x10;
            }
            else {
              uVar5 = uVar15 * 2;
              if (SBORROW4(uVar15,uVar5) != 0 < (int)uVar15) {
                uVar15 = uVar5;
                if (pvVar7 == (void *)0x0) {
                  pvVar7 = malloc((ulong)uVar5);
                }
                else {
                  pvVar7 = realloc(pvVar7,(ulong)uVar5);
                }
              }
            }
          }
          *(char *)((long)pvVar7 + uVar14 + (long)(int)uVar3) = cVar1;
          uVar14 = uVar14 + 1;
        } while (((uint)sVar8 & 0x7fffffff) != uVar14);
        __ptr_00[1] = uVar3 + (int)uVar14;
        *__ptr_00 = uVar15;
        *(void **)(__ptr_00 + 2) = pvVar7;
      }
      uVar15 = __ptr_00[1];
      uVar3 = *__ptr_00;
      if (uVar15 == uVar3) {
        if ((int)uVar3 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar7 = malloc(0x10);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr_00 + 2),0x10);
          }
          sVar8 = 0x10;
        }
        else {
          sVar8 = (ulong)uVar3 * 2;
          if ((int)sVar8 <= (int)uVar3) goto LAB_002dcdb5;
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar7 = malloc(sVar8);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr_00 + 2),sVar8);
          }
        }
        *(void **)(__ptr_00 + 2) = pvVar7;
        *__ptr_00 = (uint)sVar8;
      }
LAB_002dcdb5:
      __ptr_00[1] = uVar15 + 1;
      *(undefined1 *)(*(long *)(__ptr_00 + 2) + (long)(int)uVar15) = 0;
      lVar13 = lVar13 + 1;
    } while (lVar13 < __ptr->nSize);
  }
  pVVar9 = pNtk->vCos;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      Vec_IntPush(p,*(int *)(*(long *)(*(long *)(*(long *)(*pVVar9->pArray[lVar13] + 0x20) + 8) +
                                      (long)**(int **)((long)pVVar9->pArray[lVar13] + 0x20) * 8) +
                            0x40));
      lVar13 = lVar13 + 1;
      pVVar9 = pNtk->vCos;
    } while (lVar13 < pVVar9->nSize);
  }
  uVar14 = (ulong)(int)__ptr_00[1];
  uVar15 = *__ptr_00;
  pvVar7 = *(void **)(__ptr_00 + 2);
  iVar12 = (int)__ptr_00[1] % 4 + -4;
  do {
    if ((uint)uVar14 == uVar15) {
      if ((int)uVar15 < 0x10) {
        if (pvVar7 == (void *)0x0) {
          pvVar7 = malloc(0x10);
        }
        else {
          pvVar7 = realloc(pvVar7,0x10);
        }
        uVar15 = 0x10;
      }
      else {
        uVar3 = uVar15 * 2;
        if (SBORROW4(uVar15,uVar3) != 0 < (int)uVar15) {
          uVar15 = uVar3;
          if (pvVar7 == (void *)0x0) {
            pvVar7 = malloc((ulong)uVar3);
          }
          else {
            pvVar7 = realloc(pvVar7,(ulong)uVar3);
          }
        }
      }
    }
    *(undefined1 *)((long)pvVar7 + uVar14) = 0;
    uVar14 = uVar14 + 1;
    iVar12 = iVar12 + 1;
  } while (iVar12 != 0);
  __ptr_00[1] = (uint)uVar14;
  *__ptr_00 = uVar15;
  *(void **)(__ptr_00 + 2) = pvVar7;
  if ((uVar14 & 3) == 0) {
    uVar15 = (int)(uint)uVar14 >> 2;
    pvVar7 = *(void **)(__ptr_00 + 2);
    if (0 < (int)uVar15) {
      uVar14 = 0;
      do {
        Vec_IntPush(p,*(int *)((long)pvVar7 + uVar14 * 4));
        uVar14 = uVar14 + 1;
      } while (uVar15 != uVar14);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    if (__ptr != (Vec_Ptr_t *)0x0) {
      free(__ptr);
    }
    if (pvVar7 != (void *)0x0) {
      free(pvVar7);
      __ptr_00[2] = 0;
      __ptr_00[3] = 0;
    }
    free(__ptr_00);
    return p;
  }
  __assert_fail("Vec_StrSize(vGates) % 4 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcMap.c"
                ,0x35f,"Vec_Int_t *Abc_NtkWriteMiniMapping(Abc_Ntk_t *)");
}

Assistant:

Vec_Int_t * Abc_NtkWriteMiniMapping( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vMapping;
    Vec_Str_t * vGates;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nNodes, nFanins, nExtra, * pArray;
    assert( Abc_NtkHasMapping(pNtk) );
    // collect nodes in the DFS order
    vNodes = Abc_NtkDfs( pNtk, 0 );
    // assign unique numbers
    nNodes = nFanins = 0;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = nNodes++;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->iTemp = nNodes++, nFanins += Abc_ObjFaninNum(pObj);
    // allocate attay to store mapping (4 counters + fanins for each node + PO drivers + gate names)
    vMapping = Vec_IntAlloc( 4 + Abc_NtkNodeNum(pNtk) + nFanins + Abc_NtkCoNum(pNtk) + 10000 );
    // write the numbers of CI/CO/Node/FF
    Vec_IntPush( vMapping, Abc_NtkCiNum(pNtk) );
    Vec_IntPush( vMapping, Abc_NtkCoNum(pNtk) );
    Vec_IntPush( vMapping, Abc_NtkNodeNum(pNtk) );
    Vec_IntPush( vMapping, Abc_NtkLatchNum(pNtk) );
    // write the nodes
    vGates = Vec_StrAlloc( 10000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_IntPush( vMapping, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vMapping, pFanin->iTemp );
        // remember this gate (to be added to the mapping later)
        Vec_StrPrintStr( vGates, Mio_GateReadName((Mio_Gate_t *)pObj->pData) );
        Vec_StrPush( vGates, '\0' );
    }
    // write the COs literals
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_IntPush( vMapping, Abc_ObjFanin0(pObj)->iTemp );
    // finish off the array
    nExtra = 4 - Vec_StrSize(vGates) % 4;
    for ( i = 0; i < nExtra; i++ )
        Vec_StrPush( vGates, '\0' );
    // add gates to the array
    assert( Vec_StrSize(vGates) % 4 == 0 );
    nExtra = Vec_StrSize(vGates) / 4;
    pArray = (int *)Vec_StrArray(vGates);
    for ( i = 0; i < nExtra; i++ )
        Vec_IntPush( vMapping, pArray[i] );
    // cleanup and return
    Vec_PtrFree( vNodes );
    Vec_StrFree( vGates );
    return vMapping;
}